

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  bool bVar3;
  uint val;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  uint uVar8;
  xmlParserErrors code;
  uint uVar9;
  uint uVar10;
  int l;
  int local_44;
  ulong local_40;
  uint local_34;
  
  uVar8 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar8 = 50000;
  }
  bVar1 = *ctxt->input->cur;
  uVar9 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar6 = (xmlChar *)0x0;
      code = XML_ERR_LITERAL_NOT_STARTED;
LAB_0013552e:
      xmlFatalErr(ctxt,code,(char *)0x0);
      return pxVar6;
    }
    uVar9 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar6 = (xmlChar *)(*xmlMalloc)(100);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlCtxtErrMemory(ctxt);
    return (xmlChar *)0x0;
  }
  local_40 = 100;
  iVar5 = 0;
  local_34 = uVar9;
  do {
    val = xmlCurrentChar(ctxt,&local_44);
    if (val == 0x200000) {
      val = 0xfffd;
    }
    if ((int)val < 0x100) {
      if ((((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0)))) ||
         (val == uVar9)) goto LAB_001354b6;
    }
    else if ((val == uVar9) ||
            ((val - 0xfffe < 0xffffe002 && val - 0x110000 < 0xfff00000) && 0xd7ff < (int)val)) {
LAB_001354b6:
      pxVar6[iVar5] = '\0';
      if ((int)val < 0x100) {
        if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0)))) {
LAB_001354de:
          xmlNextChar(ctxt);
          return pxVar6;
        }
      }
      else if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800)
      goto LAB_001354de;
      code = XML_ERR_LITERAL_NOT_FINISHED;
      goto LAB_0013552e;
    }
    iVar4 = (int)local_40;
    if (iVar4 <= iVar5 + 5) {
      uVar9 = 1;
      if (((0 < iVar4) && (uVar9 = 0xffffffff, iVar4 < (int)uVar8)) &&
         (uVar10 = iVar4 + 1U >> 1, uVar9 = uVar10 + iVar4, (int)(uVar8 - uVar10) < iVar4)) {
        uVar9 = uVar8;
      }
      if ((int)uVar9 < 0) {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
        (*xmlFree)(pxVar6);
LAB_00135438:
        bVar3 = false;
      }
      else {
        pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)uVar9);
        if (pxVar7 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar6);
          xmlCtxtErrMemory(ctxt);
          goto LAB_00135438;
        }
        bVar3 = true;
        local_40 = (ulong)uVar9;
        pxVar6 = pxVar7;
      }
      uVar9 = local_34;
      if (!bVar3) {
        return (xmlChar *)0x0;
      }
    }
    if ((int)val < 0x80) {
      pxVar6[iVar5] = (xmlChar)val;
      iVar5 = iVar5 + 1;
    }
    else {
      iVar4 = xmlCopyCharMultiByte(pxVar6 + iVar5,val);
      iVar5 = iVar4 + iVar5;
    }
    pxVar2 = ctxt->input;
    if (*pxVar2->cur == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    pxVar2->cur = pxVar2->cur + local_44;
  } while( true );
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, cur);
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}